

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void sortScripts(vector<chatra::Script,_std::allocator<chatra::Script>_> *scripts)

{
  iterator iVar1;
  iterator iVar2;
  vector<chatra::Script,_std::allocator<chatra::Script>_> *scripts_local;
  
  iVar1 = std::vector<chatra::Script,_std::allocator<chatra::Script>_>::begin(scripts);
  iVar2 = std::vector<chatra::Script,_std::allocator<chatra::Script>_>::end(scripts);
  std::
  sort<__gnu_cxx::__normal_iterator<chatra::Script*,std::vector<chatra::Script,std::allocator<chatra::Script>>>,sortScripts(std::vector<chatra::Script,std::allocator<chatra::Script>>&)::__0>
            (iVar1._M_current,iVar2._M_current);
  return;
}

Assistant:

static void sortScripts(std::vector<cha::Script>& scripts) {
	std::sort(scripts.begin(), scripts.end(), [](const cha::Script& a, const cha::Script& b) {
		return a.name < b.name;
	});
}